

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall
TArray<cluster_info_t,_cluster_info_t>::Reserve
          (TArray<cluster_info_t,_cluster_info_t> *this,uint amount)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  FString *pFVar4;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar2 = uVar1 + amount;
  this->Count = uVar2;
  if (uVar1 < uVar2) {
    pFVar4 = &this->Array[uVar1].FinaleFlat;
    lVar3 = (ulong)uVar2 - (ulong)uVar1;
    do {
      pFVar4->Chars = (char *)0x87e02c;
      pFVar4[1].Chars = (char *)0x87e02c;
      pFVar4[2].Chars = (char *)0x87e02c;
      pFVar4[3].Chars = (char *)0x87e02c;
      pFVar4[6].Chars = (char *)0x87e02c;
      pFVar4 = pFVar4 + 9;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    FString::NullString.RefCount = FString::NullString.RefCount + amount * 5;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}